

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::visitModule(Reducer *this,Module *curr)

{
  Module *pMVar1;
  pointer puVar2;
  long *plVar3;
  Expression *parent;
  Expression *pEVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  pointer pEVar9;
  bool bVar10;
  int iVar11;
  Index IVar12;
  ostream *poVar13;
  long lVar14;
  undefined8 *puVar15;
  Expression **ppEVar16;
  Type TVar17;
  ulong uVar18;
  ulong uVar19;
  undefined1 auVar20 [8];
  long lVar21;
  unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_> *exp;
  pointer puVar22;
  Name NVar23;
  Name NVar24;
  Iterator IVar25;
  Signature SVar26;
  HeapType local_100;
  undefined1 auStack_f8 [8];
  Export exp_2;
  undefined4 uStack_ec;
  undefined1 auStack_c8 [8];
  vector<wasm::Export,_std::allocator<wasm::Export>_> exports;
  undefined1 auStack_a8 [8];
  ProgramResult result;
  undefined1 auStack_58 [8];
  vector<wasm::Export,_std::allocator<wasm::Export>_> currExports;
  ulong local_38;
  
  if ((this->module)._M_t.super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>.
      _M_t.super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
      super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl != curr) {
    __assert_fail("curr == module.get()",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-reduce.cpp"
                  ,0x3d5,"void Reducer::visitModule(Module *)");
  }
  do {
    bVar10 = reduceFunctions(this);
  } while (bVar10);
  shrinkElementSegments(this);
  poVar13 = std::operator<<((ostream *)&std::cerr,"|    try to remove exports (with factor ");
  poVar13 = (ostream *)std::ostream::operator<<((ostream *)poVar13,this->factor);
  std::operator<<(poVar13,")\n");
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_c8 = (undefined1  [8])0x0;
  exports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  puVar2 = *(pointer *)
            ((long)&(pMVar1->exports).
                    super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
            + 8);
  for (puVar22 = *(pointer *)
                  &(pMVar1->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
      ; puVar22 != puVar2; puVar22 = puVar22 + 1) {
    std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
              ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_c8,
               (value_type *)
               (puVar22->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>);
  }
  local_38 = 1;
  for (uVar19 = 0;
      uVar19 < (ulong)(((long)exports.
                              super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                              _M_impl.super__Vector_impl_data._M_start - (long)auStack_c8) / 0x30);
      uVar19 = uVar19 + 1) {
    iVar11 = this->factor / 100;
    if (iVar11 < 1000) {
      iVar11 = 999;
    }
    bVar10 = shouldTryToReduce(this,(ulong)(iVar11 + 1));
    if (bVar10) {
      auStack_58 = (undefined1  [8])0x0;
      currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      lVar21 = uVar19 * 0x30;
      for (uVar18 = uVar19;
          ((ulong)(((long)currExports.
                          super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
                          super__Vector_impl_data._M_start - (long)auStack_58) / 0x30) < local_38 &&
          (uVar18 < (ulong)(((long)exports.
                                   super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)auStack_c8) /
                           0x30))); uVar18 = uVar18 + 1) {
        auStack_a8 = *(undefined1 (*) [8])((long)auStack_c8 + lVar21);
        result._0_8_ = *(undefined8 *)((pointer)((long)auStack_c8 + lVar21) + 8);
        result.output._M_dataplus._M_p = *(pointer *)((long)auStack_c8 + lVar21 + 0x10);
        result.output._M_string_length =
             *(size_type *)((pointer)((long)auStack_c8 + lVar21 + 0x10) + 8);
        result.output.field_2._M_allocated_capacity =
             *(undefined8 *)((long)auStack_c8 + lVar21 + 0x20);
        result.output.field_2._8_8_ =
             *(undefined8 *)((pointer)((long)auStack_c8 + lVar21 + 0x20) + 8);
        NVar23.super_IString.str._M_str = (char *)auStack_a8;
        NVar23.super_IString.str._M_len =
             (size_t)(this->module)._M_t.
                     super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                     super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                     super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
        lVar14 = wasm::Module::getExportOrNull(NVar23);
        if (lVar14 != 0) {
          std::vector<wasm::Export,_std::allocator<wasm::Export>_>::push_back
                    ((vector<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_58,
                     (value_type *)auStack_a8);
          NVar24.super_IString.str._M_str = (char *)auStack_a8;
          NVar24.super_IString.str._M_len =
               (size_t)(this->module)._M_t.
                       super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                       super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                       super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
          wasm::Module::removeExport(NVar24);
        }
        lVar21 = lVar21 + 0x30;
      }
      result._0_8_ = &result.output._M_string_length;
      result.output._M_dataplus._M_p = (pointer)0x0;
      result.output._M_string_length = result.output._M_string_length & 0xffffffffffffff00;
      bVar10 = writeAndTestReduction(this,(ProgramResult *)auStack_a8);
      pEVar9 = currExports.super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>._M_impl.
               super__Vector_impl_data._M_start;
      auVar20 = auStack_58;
      if (bVar10) {
        poVar13 = std::operator<<((ostream *)&std::cerr,"|      removed ");
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::operator<<(poVar13," exports\n");
        noteReduction(this,((long)currExports.
                                  super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                  _M_impl.super__Vector_impl_data._M_start - (long)auStack_58) /
                           0x30);
        uVar19 = uVar19 + local_38;
        local_38 = local_38 * 2;
        if ((ulong)(long)this->factor <= local_38) {
          local_38 = (long)this->factor;
        }
      }
      else {
        for (; auVar20 != (undefined1  [8])pEVar9; auVar20 = (undefined1  [8])((long)auVar20 + 0x30)
            ) {
          auStack_f8 = *(undefined1 (*) [8])auVar20;
          _exp_2 = *(ulong *)((long)auVar20 + 8);
          uVar5 = *(undefined8 *)((long)auVar20 + 0x10);
          uVar6 = *(undefined8 *)((long)auVar20 + 0x18);
          uVar7 = *(undefined8 *)((long)auVar20 + 0x20);
          uVar8 = *(undefined8 *)((long)auVar20 + 0x28);
          pMVar1 = (this->module)._M_t.
                   super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
                   super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
                   super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
          puVar15 = (undefined8 *)operator_new(0x30);
          puVar15[4] = uVar7;
          puVar15[5] = uVar8;
          puVar15[2] = uVar5;
          puVar15[3] = uVar6;
          *puVar15 = auStack_f8;
          puVar15[1] = _exp_2;
          wasm::Module::addExport((Export *)pMVar1);
        }
        bVar10 = local_38 < 2;
        local_38 = local_38 >> 1;
        if (bVar10) {
          local_38 = 1;
        }
      }
      std::__cxx11::string::~string((string *)&result);
      std::_Vector_base<wasm::Export,_std::allocator<wasm::Export>_>::~_Vector_base
                ((_Vector_base<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_58);
    }
  }
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  bVar10 = std::
           all_of<__gnu_cxx::__normal_iterator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>*,std::vector<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>,std::allocator<std::unique_ptr<wasm::ElementSegment,std::default_delete<wasm::ElementSegment>>>>>,Reducer::visitModule(wasm::Module*)::_lambda(auto:1&)_1_>
                     (*(undefined8 *)
                       &(pMVar1->elementSegments).
                        super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                        ._M_impl,
                      *(pointer *)
                       ((long)&(pMVar1->elementSegments).
                               super__Vector_base<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>,_std::allocator<std::unique_ptr<wasm::ElementSegment,_std::default_delete<wasm::ElementSegment>_>_>_>
                       + 8),((long)exports.
                                   super__Vector_base<wasm::Export,_std::allocator<wasm::Export>_>.
                                   _M_impl.super__Vector_impl_data._M_start - (long)auStack_c8) %
                            0x30);
  pMVar1 = (this->module)._M_t.
           super___uniq_ptr_impl<wasm::Module,_std::default_delete<wasm::Module>_>._M_t.
           super__Tuple_impl<0UL,_wasm::Module_*,_std::default_delete<wasm::Module>_>.
           super__Head_base<0UL,_wasm::Module_*,_false>._M_head_impl;
  plVar3 = *(long **)&(pMVar1->functions).
                      super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                      ._M_impl;
  if ((((long)*(pointer *)
               ((long)&(pMVar1->functions).
                       super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
               + 8) - (long)plVar3 == 8) &&
      (bVar10 && *(pointer *)
                  &(pMVar1->exports).
                   super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                 == *(pointer *)
                     ((long)&(pMVar1->exports).
                             super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                     + 8))) && (lVar21 = *plVar3, *(long *)(lVar21 + 0x20) == 0)) {
    parent = *(Expression **)(lVar21 + 0x60);
    if (((0x34 < (ulong)parent->_id) ||
        ((0x1000000000000aU >> ((ulong)parent->_id & 0x3f) & 1) == 0)) || (parent[1].type.id == 0))
    {
      auStack_58 = *(undefined1 (*) [8])(lVar21 + 0x38);
      wasm::AbstractChildIterator<wasm::ChildIterator>::AbstractChildIterator
                ((AbstractChildIterator<wasm::ChildIterator> *)auStack_a8,parent);
      _exp_2 = _exp_2 & 0xffffffff00000000;
      auStack_f8 = (undefined1  [8])auStack_a8;
      IVar25 = wasm::AbstractChildIterator<wasm::ChildIterator>::end
                         ((AbstractChildIterator<wasm::ChildIterator> *)auStack_a8);
      IVar12 = 0;
      auVar20 = (undefined1  [8])auStack_a8;
LAB_00125826:
      if ((IVar12 == IVar25.index) && (auVar20 == (undefined1  [8])IVar25.parent))
      goto LAB_001258c3;
      ppEVar16 = wasm::AbstractChildIterator<wasm::ChildIterator>::Iterator::operator*
                           ((Iterator *)auStack_f8);
      pEVar4 = *ppEVar16;
      if ((pEVar4->type).id != 1) {
        TVar17.id = wasm::HeapType::getSignature();
        SVar26.results.id = (pEVar4->type).id;
        SVar26.params.id = TVar17.id;
        wasm::HeapType::HeapType(&local_100,SVar26);
        *(uintptr_t *)(lVar21 + 0x38) = local_100.id;
        *(Expression **)(lVar21 + 0x60) = pEVar4;
        bVar10 = writeAndTestReduction(this);
        if (bVar10) {
          std::operator<<((ostream *)&std::cerr,"|    altered function result type\n");
          noteReduction(this,1);
LAB_001258c3:
          std::_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_>::
          ~_Vector_base((_Vector_base<wasm::Expression_**,_std::allocator<wasm::Expression_**>_> *)
                        ((long)&result.output.field_2 + 8));
          goto LAB_001258cc;
        }
        *(undefined1 (*) [8])(lVar21 + 0x38) = auStack_58;
        *(Expression **)(lVar21 + 0x60) = parent;
      }
      IVar12 = _exp_2 + 1;
      _exp_2 = CONCAT44(uStack_ec,IVar12);
      auVar20 = auStack_f8;
      goto LAB_00125826;
    }
  }
LAB_001258cc:
  std::_Vector_base<wasm::Export,_std::allocator<wasm::Export>_>::~_Vector_base
            ((_Vector_base<wasm::Export,_std::allocator<wasm::Export>_> *)auStack_c8);
  return;
}

Assistant:

void visitModule(Module* curr) {
    // The initial module given to us is our global object. As we continue to
    // process things here, we may replace the module, so we should never again
    // refer to curr.
    assert(curr == module.get());
    curr = nullptr;

    // Reduction of entire functions at a time is very effective, and we do it
    // with exponential growth and backoff, so keep doing it while it works.
    while (reduceFunctions()) {
    }

    shrinkElementSegments();

    // try to remove exports
    std::cerr << "|    try to remove exports (with factor " << factor << ")\n";
    std::vector<Export> exports;
    for (auto& exp : module->exports) {
      exports.push_back(*exp);
    }
    size_t skip = 1;
    for (size_t i = 0; i < exports.size(); i++) {
      if (!shouldTryToReduce(std::max((factor / 100) + 1, 1000))) {
        continue;
      }
      std::vector<Export> currExports;
      for (size_t j = 0; currExports.size() < skip && i + j < exports.size();
           j++) {
        auto exp = exports[i + j];
        if (module->getExportOrNull(exp.name)) {
          currExports.push_back(exp);
          module->removeExport(exp.name);
        }
      }
      ProgramResult result;
      if (!writeAndTestReduction(result)) {
        for (auto exp : currExports) {
          module->addExport(new Export(exp));
        }
        skip = std::max(skip / 2, size_t(1)); // or 1?
      } else {
        std::cerr << "|      removed " << currExports.size() << " exports\n";
        noteReduction(currExports.size());
        i += skip;
        skip = std::min(size_t(factor), 2 * skip);
      }
    }
    // If we are left with a single function that is not exported or used in
    // a table, that is useful as then we can change the return type.
    bool allTablesEmpty =
      std::all_of(module->elementSegments.begin(),
                  module->elementSegments.end(),
                  [&](auto& segment) { return segment->data.empty(); });

    if (module->functions.size() == 1 && module->exports.empty() &&
        allTablesEmpty) {
      auto* func = module->functions[0].get();
      // We can't remove something that might have breaks to it.
      if (!func->imported() && !Properties::isNamedControlFlow(func->body)) {
        auto funcType = func->type;
        auto* funcBody = func->body;
        for (auto* child : ChildIterator(func->body)) {
          if (!(child->type.isConcrete() || child->type == Type::none)) {
            continue; // not something a function can return
          }
          // Try to replace the body with the child, fixing up the function
          // to accept it.
          func->type = Signature(funcType.getSignature().params, child->type);
          func->body = child;
          if (writeAndTestReduction()) {
            // great, we succeeded!
            std::cerr << "|    altered function result type\n";
            noteReduction(1);
            break;
          }
          // Undo.
          func->type = funcType;
          func->body = funcBody;
        }
      }
    }
  }